

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnpackedStructType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UnpackedStructType,slang::ast::Compilation&,slang::SourceLocation,slang::ast::ASTContext_const&>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1,ASTContext *args_2)

{
  UnpackedStructType *pUVar1;
  size_t in_RCX;
  ASTContext *in_RDX;
  Compilation *in_RSI;
  UnpackedStructType *in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pUVar1 = (UnpackedStructType *)allocate((BumpAllocator *)in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  ast::UnpackedStructType::UnpackedStructType(in_RDI,in_RSI,unaff_retaddr,in_RDX);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }